

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * cmSplitExtension(string *__return_storage_ptr__,string *in,string *base)

{
  long lVar1;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::rfind((char *)in,0x5b6916,0xffffffffffffffff);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)base);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)in);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)in);
    std::__cxx11::string::operator=((string *)base,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSplitExtension(std::string const& in, std::string& base)
{
  std::string ext;
  std::string::size_type dot_pos = in.rfind(".");
  if(dot_pos != std::string::npos)
    {
    // Remove the extension first in case &base == &in.
    ext = in.substr(dot_pos, std::string::npos);
    base = in.substr(0, dot_pos);
    }
  else
    {
    base = in;
    }
  return ext;
}